

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O1

void multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
               (uchar **strings,size_t N,size_t depth)

{
  byte bVar1;
  uchar *puVar2;
  uint j;
  uint uVar3;
  long lVar4;
  uint uVar5;
  size_t sVar6;
  size_t N_00;
  ulong uVar7;
  ulong uVar8;
  size_t N_01;
  ulong uVar9;
  size_t N_02;
  uint j_1;
  uchar **t;
  uchar **ppuVar10;
  ulong uVar11;
  array<vector_block<unsigned_char_*,_1024U>,_3UL> buckets;
  array<unsigned_int,_32UL> cache;
  vector_block<unsigned_char_*,_1024U> local_128;
  vector_block<unsigned_char_*,_1024U> local_100;
  vector_block<unsigned_char_*,_1024U> local_d8;
  uint auStack_b0 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  lVar4 = 0;
  do {
    *(undefined8 *)
     ((long)&local_128._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar4) = 0;
    *(undefined8 *)((long)&local_128._insertpos + lVar4) = 0;
    *(undefined8 *)
     ((long)&local_128._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start + lVar4) = 0;
    *(undefined8 *)
     ((long)&local_128._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar4) = 0;
    *(undefined4 *)((long)&local_128._left_in_block + lVar4) = 0;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0x78);
  uVar3 = pseudo_median<unsigned_int>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    ppuVar10 = strings;
    do {
      lVar4 = 0;
      do {
        puVar2 = ppuVar10[lVar4];
        if (puVar2 == (uchar *)0x0) goto LAB_0021fccc;
        bVar1 = puVar2[depth];
        if (bVar1 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)bVar1 << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar5 = (uint)bVar1 << 0x18 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar5 = uVar5 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        auStack_b0[lVar4] = uVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x20);
      lVar4 = 0;
      t = ppuVar10;
      do {
        uVar5 = auStack_b0[lVar4];
        vector_block<unsigned_char_*,_1024U>::push_back
                  (&local_128 +
                   (ulong)(uVar5 == uVar3) + (ulong)(uVar3 <= uVar5 && uVar5 != uVar3) * 2,t);
        lVar4 = lVar4 + 1;
        t = t + 1;
      } while (lVar4 != 0x20);
      uVar9 = uVar9 + 0x20;
      ppuVar10 = ppuVar10 + 0x20;
    } while (uVar9 < (N & 0xffffffffffffffe0));
  }
  lVar4 = N - uVar9;
  if (uVar9 <= N && lVar4 != 0) {
    ppuVar10 = strings + uVar9;
    do {
      puVar2 = *ppuVar10;
      if (puVar2 == (uchar *)0x0) {
LAB_0021fccc:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x38,"uint32_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (uint)puVar2[depth] << 0x18;
        if (puVar2[depth + 1] != 0) {
          uVar5 = uVar5 | (uint)puVar2[depth + 1] << 0x10;
          if (puVar2[depth + 2] != '\0') {
            uVar5 = uVar5 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
          }
        }
      }
      vector_block<unsigned_char_*,_1024U>::push_back
                (&local_128 +
                 (ulong)(uVar5 == uVar3) + (ulong)(uVar3 <= uVar5 && uVar5 != uVar3) * 2,ppuVar10);
      ppuVar10 = ppuVar10 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  uVar9 = (long)local_128._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start;
  N_00 = uVar9 * 0x80 - (ulong)local_128._left_in_block;
  uVar7 = (long)local_100._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_100._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start;
  N_02 = uVar7 * 0x80 - (ulong)local_100._left_in_block;
  uVar8 = (long)local_d8._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_d8._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start;
  N_01 = uVar8 * 0x80 - (ulong)local_d8._left_in_block;
  if (N_00 + N_02 + N_01 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_block<unsigned char *>, CharT = unsigned int]"
                 );
  }
  if (uVar9 * 0x80 != (ulong)local_128._left_in_block) {
    if (local_128._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_128._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021fceb;
    ppuVar10 = strings;
    if (8 < uVar9) {
      uVar11 = 2;
      if (2 < (ulong)((long)uVar9 >> 3)) {
        uVar11 = (long)uVar9 >> 3;
      }
      lVar4 = 0;
      do {
        memmove(ppuVar10,local_128._index_block.
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar4],0x2000);
        ppuVar10 = ppuVar10 + 0x400;
        lVar4 = lVar4 + 1;
      } while (uVar11 - 1 != lVar4);
    }
    sVar6 = (long)local_128._insertpos -
            (long)local_128._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar6 != 0) {
      memmove(ppuVar10,local_128._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],sVar6);
    }
  }
  if (uVar7 * 0x80 != (ulong)local_100._left_in_block) {
    if (local_100._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_100._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021fceb;
    ppuVar10 = strings + N_00;
    if (8 < uVar7) {
      uVar9 = 2;
      if (2 < (ulong)((long)uVar7 >> 3)) {
        uVar9 = (long)uVar7 >> 3;
      }
      lVar4 = 0;
      do {
        memmove(ppuVar10,local_100._index_block.
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar4],0x2000);
        ppuVar10 = ppuVar10 + 0x400;
        lVar4 = lVar4 + 1;
      } while (uVar9 - 1 != lVar4);
    }
    sVar6 = (long)local_100._insertpos -
            (long)local_100._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar6 != 0) {
      memmove(ppuVar10,local_100._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],sVar6);
    }
  }
  if (uVar8 * 0x80 != (ulong)local_d8._left_in_block) {
    if (local_d8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_d8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0021fceb:
      __assert_fail("not v._index_block.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                    ,0x5b,
                    "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                   );
    }
    ppuVar10 = strings + N_00 + N_02;
    if (8 < uVar8) {
      uVar9 = 2;
      if (2 < (ulong)((long)uVar8 >> 3)) {
        uVar9 = (long)uVar8 >> 3;
      }
      lVar4 = 0;
      do {
        memmove(ppuVar10,local_d8._index_block.
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar4],0x2000);
        ppuVar10 = ppuVar10 + 0x400;
        lVar4 = lVar4 + 1;
      } while (uVar9 - 1 != lVar4);
    }
    sVar6 = (long)local_d8._insertpos -
            (long)local_d8._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar6 != 0) {
      memmove(ppuVar10,local_d8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],sVar6);
    }
  }
  vector_block<unsigned_char_*,_1024U>::clear(&local_128);
  vector_block<unsigned_char_*,_1024U>::clear(&local_100);
  vector_block<unsigned_char_*,_1024U>::clear(&local_d8);
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>(strings,N_00,depth);
  if ((char)uVar3 != '\0') {
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>(strings + N_00,N_02,depth + 4)
    ;
  }
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
            (strings + N_00 + N_02,N_01,depth);
  lVar4 = 0x50;
  do {
    vector_block<unsigned_char_*,_1024U>::~vector_block
              ((vector_block<unsigned_char_*,_1024U> *)
               ((long)&local_128._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x28);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}